

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall pbrt::Image::Image(Image *this,Image *param_2)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  ColorEncoding *in_stack_ffffffffffffffb8;
  ColorEncoding *in_stack_ffffffffffffffc0;
  
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RSI + 1);
  *in_RDI = *in_RSI;
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RDI + 2),
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RSI + 2));
  ColorEncoding::ColorEncoding(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)(in_RDI + 7)
             ,(vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
              (in_RSI + 7));
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::vector
            ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)(in_RDI + 0xb),
             (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)(in_RSI + 0xb));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0xf),
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RSI + 0xf));
  return;
}

Assistant:

Image(Allocator alloc = {})
        : p8(alloc),
          p16(alloc),
          p32(alloc),
          format(PixelFormat::U256),
          resolution(0, 0) {}